

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O3

SampleInstance * __thiscall Prog::new_sample_instance(Prog *this)

{
  pointer ppSVar1;
  ulong uVar2;
  SampleInstance *this_00;
  long lVar3;
  SampleInstance *local_18;
  
  this_00 = (SampleInstance *)operator_new(0x38);
  SampleInstance::SampleInstance(this_00);
  ppSVar1 = (this->samples).super__Vector_base<const_Sample_*,_std::allocator<const_Sample_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->samples).super__Vector_base<const_Sample_*,_std::allocator<const_Sample_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1;
  if (lVar3 != 0) {
    uVar2 = (ulong)new_sample_instance::i;
    new_sample_instance::i = new_sample_instance::i + 1;
    SampleInstance::set_sample(this_00,ppSVar1[uVar2 % (ulong)(lVar3 >> 3)]);
    new_sample_instance::i = new_sample_instance::i + 1;
  }
  local_18 = this_00;
  std::vector<Element*,std::allocator<Element*>>::emplace_back<Element*>
            ((vector<Element*,std::allocator<Element*>> *)&this->elements,(Element **)&local_18);
  return this_00;
}

Assistant:

SampleInstance *Prog::new_sample_instance()
{
   SampleInstance *splinst = new SampleInstance();
   if (samples.size() > 0) {
      static unsigned i = 0;
      unsigned n = (i++) % samples.size();
      splinst->set_sample(*samples[n]);
      i++;
   }
   elements.push_back(splinst);
   return splinst;
}